

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

int lift_object(obj *obj,obj *container,long *cnt_p,boolean telekinesis)

{
  int iVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  obj *poVar7;
  char *pcVar8;
  char *local_168;
  long savequan;
  char qbuf [256];
  int local_3c;
  int next_encumbr;
  int prev_encumbr;
  int new_wt;
  int old_wt;
  int result;
  boolean telekinesis_local;
  long *cnt_p_local;
  obj *container_local;
  obj *obj_local;
  
  old_wt._3_1_ = telekinesis;
  _result = cnt_p;
  cnt_p_local = (long *)container;
  container_local = obj;
  if ((obj->otyp == 0x214) && (u.uz.dnum == dungeon_topology.d_sokoban_dnum)) {
    pcVar4 = body_part(6);
    pcVar5 = xname(container_local);
    pline("You cannot get your %s around this %s.",pcVar4,pcVar5);
    obj_local._4_4_ = -1;
  }
  else if ((obj->otyp == 0x210) ||
          ((obj->otyp == 0x214 && (((youmonst.data)->mflags2 & 0x8000000) != 0)))) {
    obj_local._4_4_ = 1;
  }
  else {
    lVar6 = carry_count(obj,container,*cnt_p,telekinesis,&prev_encumbr,&next_encumbr);
    *_result = lVar6;
    if (*_result < 1) {
      new_wt = -1;
    }
    else {
      iVar3 = inv_cnt();
      if ((iVar3 < 0x34) || (poVar7 = merge_choice(invent,container_local), poVar7 != (obj *)0x0)) {
        new_wt = 1;
        local_3c = near_capacity();
        if (local_3c < flags.pickup_burden) {
          local_3c = flags.pickup_burden;
        }
        iVar3 = calc_capacity(next_encumbr - prev_encumbr);
        if (local_3c < iVar3) {
          if (old_wt._3_1_ == '\0') {
            iVar1 = container_local->quan;
            container_local->quan = (int)*_result;
            if (iVar3 < 4) {
              local_168 = "You have a little trouble lifting";
              if (2 < iVar3) {
                local_168 = "You have much trouble lifting";
              }
            }
            else {
              local_168 = "You have extreme difficulty lifting";
            }
            strcpy((char *)&savequan,local_168);
            pcVar4 = eos((char *)&savequan);
            pcVar5 = doname(container_local);
            pcVar8 = simple_typename((int)container_local->otyp);
            pcVar8 = an(pcVar8);
            pcVar5 = safe_qbuf((char *)&savequan,0xd,pcVar5,pcVar8,"something");
            sprintf(pcVar4," %s. Continue?",pcVar5);
            container_local->quan = iVar1;
            cVar2 = yn_function((char *)&savequan,"ynq",'q');
            if (cVar2 == 'n') {
              new_wt = 0;
            }
            else if (cVar2 == 'q') {
              new_wt = -1;
            }
          }
          else {
            new_wt = 0;
          }
        }
      }
      else {
        pline("Your knapsack cannot accommodate any more items.");
        new_wt = -1;
      }
    }
    if (((container_local->otyp == 0x155) && (new_wt < 1)) && (cnt_p_local == (long *)0x0)) {
      container_local->spe = '\0';
    }
    obj_local._4_4_ = new_wt;
  }
  return obj_local._4_4_;
}

Assistant:

static int lift_object(struct obj *obj, struct obj *container,
		       long *cnt_p, boolean telekinesis)
{
    int result, old_wt, new_wt, prev_encumbr, next_encumbr;

    if (obj->otyp == BOULDER && In_sokoban(&u.uz)) {
	pline("You cannot get your %s around this %s.",
			body_part(HAND), xname(obj));
	return -1;
    }
    if (obj->otyp == LOADSTONE ||
	    (obj->otyp == BOULDER && throws_rocks(youmonst.data)))
	return 1;		/* lift regardless of current situation */

    *cnt_p = carry_count(obj, container, *cnt_p, telekinesis, &old_wt, &new_wt);
    if (*cnt_p < 1L) {
	result = -1;	/* nothing lifted */
    } else if (inv_cnt() >= 52 && !merge_choice(invent, obj)) {
	pline("Your knapsack cannot accommodate any more items.");
	result = -1;	/* nothing lifted */
    } else {
	result = 1;
	prev_encumbr = near_capacity();
	if (prev_encumbr < flags.pickup_burden)
		prev_encumbr = flags.pickup_burden;
	next_encumbr = calc_capacity(new_wt - old_wt);
	if (next_encumbr > prev_encumbr) {
	    if (telekinesis) {
		result = 0;	/* don't lift */
	    } else {
		char qbuf[BUFSZ];
		long savequan = obj->quan;

		obj->quan = *cnt_p;
		strcpy(qbuf,
			(next_encumbr > HVY_ENCUMBER) ? overloadmsg :
			(next_encumbr > MOD_ENCUMBER) ? nearloadmsg :
			moderateloadmsg);
		sprintf(eos(qbuf), " %s. Continue?",
			safe_qbuf(qbuf, sizeof(" . Continue?"),
				doname(obj), an(simple_typename(obj->otyp)), "something"));
		obj->quan = savequan;
		switch (ynq(qbuf)) {
		    case 'q':  result = -1; break;
		    case 'n':  result =  0; break;
		    default:   break;	/* 'y' => result == 1 */
		}
	    }
	}
    }

    if (obj->otyp == SCR_SCARE_MONSTER && result <= 0 && !container)
	obj->spe = 0;
    return result;
}